

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

int tcu::anon_unknown_50::findNumPositionDeviationFailingPixels
              (PixelBufferAccess *errorMask,ConstPixelBufferAccess *reference,
              ConstPixelBufferAccess *result,UVec4 *threshold,IVec3 *maxPositionDeviation,
              bool acceptOutOfBoundsAsAnyValue)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  InternalError *this;
  int z;
  ulong uVar6;
  int y;
  int iVar7;
  int iVar8;
  undefined3 in_register_00000089;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  Vector<bool,_4> res_1;
  Vector<bool,_4> res;
  IVec4 cmpPix;
  IVec4 refPix;
  undefined4 local_cc;
  ulong local_c8;
  int local_c0;
  int local_bc;
  uint local_b8;
  uint local_b4;
  int local_b0;
  int local_ac;
  PixelBufferAccess *local_a8;
  UVec4 *local_a0;
  undefined1 local_98 [32];
  undefined1 local_78 [20];
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  void *local_58;
  int aiStack_50 [2];
  IVec4 local_48;
  
  local_48.m_data[0] = 0;
  local_48.m_data[1] = 0xff;
  local_48.m_data[2] = 0;
  local_48.m_data[3] = 0xff;
  local_58 = (void *)0xff;
  aiStack_50[0] = 0;
  aiStack_50[1] = 0xff;
  iVar12 = (reference->m_size).m_data[0];
  uVar17 = (reference->m_size).m_data[1];
  iVar2 = (reference->m_size).m_data[2];
  z = 0;
  local_b0 = 0;
  local_b4 = 0;
  iVar11 = iVar12;
  local_bc = iVar2;
  local_b8 = uVar17;
  if (CONCAT31(in_register_00000089,acceptOutOfBoundsAsAnyValue) != 0) {
    local_b0 = maxPositionDeviation->m_data[0];
    local_b4 = maxPositionDeviation->m_data[1];
    z = maxPositionDeviation->m_data[2];
    iVar11 = iVar12 - local_b0;
    local_b8 = uVar17 - local_b4;
    local_bc = iVar2 - z;
  }
  local_a8 = errorMask;
  local_a0 = threshold;
  local_98._24_8_ = reference;
  if ((((result->m_size).m_data[0] != iVar12) || ((result->m_size).m_data[1] != uVar17)) ||
     ((result->m_size).m_data[2] != iVar2)) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x6c);
    __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
  }
  clear(errorMask,&local_48);
  local_c0 = 0;
  if (z < local_bc) {
    iVar2 = iVar2 + -1;
    iVar1 = uVar17 - 1;
    iVar12 = iVar12 + -1;
    local_c0 = 0;
    local_ac = iVar11;
    do {
      uVar17 = local_b4;
      if ((int)local_b4 < (int)local_b8) {
        do {
          local_c8 = (ulong)uVar17;
          y = local_b0;
          if (local_b0 < iVar11) {
            do {
              iVar9 = (int)local_c8;
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)(local_78 + 0x10),(int)local_98._24_8_,y,iVar9);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_78,(int)result,y,iVar9);
              uVar17 = (int)(local_78._16_4_ - local_78._0_4_) >> 0x1f;
              uVar18 = iStack_64 - local_78._4_4_ >> 0x1f;
              uVar19 = iStack_60 - local_78._8_4_ >> 0x1f;
              uVar20 = iStack_5c - local_78._12_4_ >> 0x1f;
              auVar14._0_4_ =
                   -(uint)((int)(local_a0->m_data[0] ^ 0x80000000) <
                          (int)((local_78._16_4_ - local_78._0_4_ ^ uVar17) - uVar17 ^ 0x80000000));
              auVar14._4_4_ =
                   -(uint)((int)(local_a0->m_data[1] ^ 0x80000000) <
                          (int)((iStack_64 - local_78._4_4_ ^ uVar18) - uVar18 ^ 0x80000000));
              auVar14._8_4_ =
                   -(uint)((int)(local_a0->m_data[2] ^ 0x80000000) <
                          (int)((iStack_60 - local_78._8_4_ ^ uVar19) - uVar19 ^ 0x80000000));
              auVar14._12_4_ =
                   -(uint)((int)(local_a0->m_data[3] ^ 0x80000000) <
                          (int)((iStack_5c - local_78._12_4_ ^ uVar20) - uVar20 ^ 0x80000000));
              auVar14 = packssdw(auVar14,auVar14);
              auVar14 = packsswb(auVar14 ^ _DAT_0021f0a0,auVar14 ^ _DAT_0021f0a0);
              local_98._0_4_ = auVar14._0_4_ & (ChannelOrder)DAT_0021e660;
              if ((char)local_98._0_4_ == '\0') {
LAB_001db9d7:
                iVar9 = maxPositionDeviation->m_data[2];
                iVar10 = z - iVar9;
                if (z - iVar9 < 1) {
                  iVar10 = 0;
                }
                iVar4 = z + iVar9;
                if (iVar2 < z + iVar9) {
                  iVar4 = iVar2;
                }
                if (iVar10 <= iVar4) {
                  iVar4 = maxPositionDeviation->m_data[1];
                  bVar13 = false;
                  do {
                    iVar11 = (int)local_c8 - iVar4;
                    if (iVar11 < 1) {
                      iVar11 = 0;
                    }
                    iVar7 = iVar4 + (int)local_c8;
                    if (iVar1 < iVar7) {
                      iVar7 = iVar1;
                    }
                    if ((iVar11 <= iVar7) && (!bVar13)) {
                      iVar9 = maxPositionDeviation->m_data[0];
                      do {
                        iVar7 = y - iVar9;
                        if (y - iVar9 < 1) {
                          iVar7 = 0;
                        }
                        iVar8 = iVar9 + y;
                        if (iVar12 < iVar9 + y) {
                          iVar8 = iVar12;
                        }
                        if ((iVar7 <= iVar8) && (!bVar13)) {
                          do {
                            ConstPixelBufferAccess::getPixelInt
                                      ((ConstPixelBufferAccess *)local_98,(int)result,iVar7,iVar11);
                            uVar17 = (int)(local_78._16_4_ - local_98._0_4_) >> 0x1f;
                            uVar18 = iStack_64 - local_98._4_4_ >> 0x1f;
                            uVar19 = iStack_60 - local_98._8_4_ >> 0x1f;
                            uVar20 = iStack_5c - local_98._12_4_ >> 0x1f;
                            auVar15._0_4_ =
                                 -(uint)((int)(local_a0->m_data[0] ^ 0x80000000) <
                                        (int)((local_78._16_4_ - local_98._0_4_ ^ uVar17) - uVar17 ^
                                             0x80000000));
                            auVar15._4_4_ =
                                 -(uint)((int)(local_a0->m_data[1] ^ 0x80000000) <
                                        (int)((iStack_64 - local_98._4_4_ ^ uVar18) - uVar18 ^
                                             0x80000000));
                            auVar15._8_4_ =
                                 -(uint)((int)(local_a0->m_data[2] ^ 0x80000000) <
                                        (int)((iStack_60 - local_98._8_4_ ^ uVar19) - uVar19 ^
                                             0x80000000));
                            auVar15._12_4_ =
                                 -(uint)((int)(local_a0->m_data[3] ^ 0x80000000) <
                                        (int)((iStack_5c - local_98._12_4_ ^ uVar20) - uVar20 ^
                                             0x80000000));
                            auVar14 = packssdw(auVar15,auVar15);
                            auVar14 = packsswb(auVar14 ^ _DAT_0021f0a0,auVar14 ^ _DAT_0021f0a0);
                            local_cc = auVar14._0_4_ & (uint)DAT_0021e660;
                            if ((char)local_cc == '\0') {
                              bVar13 = false;
                            }
                            else {
                              uVar5 = 0;
                              do {
                                uVar6 = uVar5;
                                if (uVar6 == 3) break;
                                uVar5 = uVar6 + 1;
                              } while (*(char *)((long)&local_cc + uVar6 + 1) != '\0');
                              bVar13 = 2 < uVar6;
                            }
                            iVar7 = iVar7 + 1;
                            iVar9 = maxPositionDeviation->m_data[0];
                            iVar4 = iVar9 + y;
                            if (iVar12 < iVar9 + y) {
                              iVar4 = iVar12;
                            }
                          } while ((iVar7 <= iVar4) && (!bVar13));
                          iVar4 = maxPositionDeviation->m_data[1];
                        }
                        iVar11 = iVar11 + 1;
                        iVar7 = (int)local_c8 + iVar4;
                        if (iVar1 < iVar7) {
                          iVar7 = iVar1;
                        }
                      } while ((iVar11 <= iVar7) && (!bVar13));
                      iVar9 = maxPositionDeviation->m_data[2];
                    }
                    iVar10 = iVar10 + 1;
                    iVar7 = z + iVar9;
                    if (iVar2 < z + iVar9) {
                      iVar7 = iVar2;
                    }
                  } while ((iVar10 <= iVar7) && (!bVar13));
                  iVar11 = local_ac;
                  if (bVar13) {
                    iVar10 = z - iVar9;
                    if (z - iVar9 < 1) {
                      iVar10 = 0;
                    }
                    if (iVar10 <= iVar7) {
                      bVar13 = false;
                      do {
                        iVar11 = (int)local_c8 - iVar4;
                        if (iVar11 < 1) {
                          iVar11 = 0;
                        }
                        iVar7 = iVar4 + (int)local_c8;
                        if (iVar1 < iVar7) {
                          iVar7 = iVar1;
                        }
                        if ((iVar11 <= iVar7) && (!bVar13)) {
                          iVar9 = maxPositionDeviation->m_data[0];
                          do {
                            iVar7 = y - iVar9;
                            if (y - iVar9 < 1) {
                              iVar7 = 0;
                            }
                            iVar8 = iVar9 + y;
                            if (iVar12 < iVar9 + y) {
                              iVar8 = iVar12;
                            }
                            if ((iVar7 <= iVar8) && (!bVar13)) {
                              do {
                                ConstPixelBufferAccess::getPixelInt
                                          ((ConstPixelBufferAccess *)local_98,(int)local_98._24_8_,
                                           iVar7,iVar11);
                                uVar17 = (int)(local_78._0_4_ - local_98._0_4_) >> 0x1f;
                                uVar18 = (int)(local_78._4_4_ - local_98._4_4_) >> 0x1f;
                                uVar19 = (int)(local_78._8_4_ - local_98._8_4_) >> 0x1f;
                                uVar20 = (int)(local_78._12_4_ - local_98._12_4_) >> 0x1f;
                                auVar16._0_4_ =
                                     -(uint)((int)(local_a0->m_data[0] ^ 0x80000000) <
                                            (int)((local_78._0_4_ - local_98._0_4_ ^ uVar17) -
                                                  uVar17 ^ 0x80000000));
                                auVar16._4_4_ =
                                     -(uint)((int)(local_a0->m_data[1] ^ 0x80000000) <
                                            (int)((local_78._4_4_ - local_98._4_4_ ^ uVar18) -
                                                  uVar18 ^ 0x80000000));
                                auVar16._8_4_ =
                                     -(uint)((int)(local_a0->m_data[2] ^ 0x80000000) <
                                            (int)((local_78._8_4_ - local_98._8_4_ ^ uVar19) -
                                                  uVar19 ^ 0x80000000));
                                auVar16._12_4_ =
                                     -(uint)((int)(local_a0->m_data[3] ^ 0x80000000) <
                                            (int)((local_78._12_4_ - local_98._12_4_ ^ uVar20) -
                                                  uVar20 ^ 0x80000000));
                                auVar14 = packssdw(auVar16,auVar16);
                                auVar14 = packsswb(auVar14 ^ _DAT_0021f0a0,auVar14 ^ _DAT_0021f0a0);
                                local_cc = auVar14._0_4_ & (uint)DAT_0021e660;
                                if ((char)local_cc == '\0') {
                                  bVar13 = false;
                                }
                                else {
                                  uVar5 = 0;
                                  do {
                                    uVar6 = uVar5;
                                    if (uVar6 == 3) break;
                                    uVar5 = uVar6 + 1;
                                  } while (*(char *)((long)&local_cc + uVar6 + 1) != '\0');
                                  bVar13 = 2 < uVar6;
                                }
                                iVar7 = iVar7 + 1;
                                iVar9 = maxPositionDeviation->m_data[0];
                                iVar4 = iVar9 + y;
                                if (iVar12 < iVar9 + y) {
                                  iVar4 = iVar12;
                                }
                              } while ((iVar7 <= iVar4) && (!bVar13));
                              iVar4 = maxPositionDeviation->m_data[1];
                            }
                            iVar11 = iVar11 + 1;
                            iVar7 = (int)local_c8 + iVar4;
                            if (iVar1 < iVar7) {
                              iVar7 = iVar1;
                            }
                          } while ((iVar11 <= iVar7) && (!bVar13));
                          iVar9 = maxPositionDeviation->m_data[2];
                        }
                        iVar10 = iVar10 + 1;
                        iVar11 = z + iVar9;
                        if (iVar2 < z + iVar9) {
                          iVar11 = iVar2;
                        }
                      } while ((iVar10 <= iVar11) && (!bVar13));
                      iVar11 = local_ac;
                      if (bVar13) goto LAB_001dbd72;
                    }
                  }
                }
                PixelBufferAccess::setPixel(local_a8,(IVec4 *)&local_58,y,(int)local_c8,z);
                local_c0 = local_c0 + 1;
              }
              else {
                uVar5 = 0xffffffffffffffff;
                do {
                  if (uVar5 == 2) goto LAB_001dbd72;
                  uVar6 = uVar5 + 1;
                  lVar3 = uVar5 + 2;
                  uVar5 = uVar6;
                } while (local_98[lVar3] != '\0');
                if (uVar6 < 3) goto LAB_001db9d7;
              }
LAB_001dbd72:
              y = y + 1;
            } while (y != iVar11);
          }
          uVar17 = (int)local_c8 + 1;
        } while (uVar17 != local_b8);
      }
      z = z + 1;
    } while (z != local_bc);
  }
  return local_c0;
}

Assistant:

static int findNumPositionDeviationFailingPixels (const PixelBufferAccess& errorMask, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, const tcu::IVec3& maxPositionDeviation, bool acceptOutOfBoundsAsAnyValue)
{
	const tcu::IVec4	okColor				(0, 255, 0, 255);
	const tcu::IVec4	errorColor			(255, 0, 0, 255);
	const int			width				= reference.getWidth();
	const int			height				= reference.getHeight();
	const int			depth				= reference.getDepth();
	int					numFailingPixels	= 0;

	// Accept pixels "sampling" over the image bounds pixels since "taps" could be anything
	const int			beginX				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.x()) : (0);
	const int			beginY				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.y()) : (0);
	const int			beginZ				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.z()) : (0);
	const int			endX				= (acceptOutOfBoundsAsAnyValue) ? (width  - maxPositionDeviation.x()) : (width);
	const int			endY				= (acceptOutOfBoundsAsAnyValue) ? (height - maxPositionDeviation.y()) : (height);
	const int			endZ				= (acceptOutOfBoundsAsAnyValue) ? (depth  - maxPositionDeviation.z()) : (depth);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);
	DE_ASSERT(endX > 0 && endY > 0 && endZ > 0);	// most likely a bug

	tcu::clear(errorMask, okColor);

	for (int z = beginZ; z < endZ; z++)
	{
		for (int y = beginY; y < endY; y++)
		{
			for (int x = beginX; x < endX; x++)
			{
				const IVec4	refPix = reference.getPixelInt(x, y, z);
				const IVec4	cmpPix = result.getPixelInt(x, y, z);

				// Exact match
				{
					const UVec4	diff = abs(refPix - cmpPix).cast<deUint32>();
					const bool	isOk = boolAll(lessThanEqual(diff, threshold));

					if (isOk)
						continue;
				}

				// Find matching pixels for both result and reference pixel

				{
					bool pixelFoundForReference = false;

					// Find deviated result pixel for reference

					for (int sz = de::max(0, z - maxPositionDeviation.z()); sz <= de::min(depth  - 1, z + maxPositionDeviation.z()) && !pixelFoundForReference; ++sz)
					for (int sy = de::max(0, y - maxPositionDeviation.y()); sy <= de::min(height - 1, y + maxPositionDeviation.y()) && !pixelFoundForReference; ++sy)
					for (int sx = de::max(0, x - maxPositionDeviation.x()); sx <= de::min(width  - 1, x + maxPositionDeviation.x()) && !pixelFoundForReference; ++sx)
					{
						const IVec4	deviatedCmpPix	= result.getPixelInt(sx, sy, sz);
						const UVec4	diff			= abs(refPix - deviatedCmpPix).cast<deUint32>();
						const bool	isOk			= boolAll(lessThanEqual(diff, threshold));

						pixelFoundForReference		= isOk;
					}

					if (!pixelFoundForReference)
					{
						errorMask.setPixel(errorColor, x, y, z);
						++numFailingPixels;
						continue;
					}
				}
				{
					bool pixelFoundForResult = false;

					// Find deviated reference pixel for result

					for (int sz = de::max(0, z - maxPositionDeviation.z()); sz <= de::min(depth  - 1, z + maxPositionDeviation.z()) && !pixelFoundForResult; ++sz)
					for (int sy = de::max(0, y - maxPositionDeviation.y()); sy <= de::min(height - 1, y + maxPositionDeviation.y()) && !pixelFoundForResult; ++sy)
					for (int sx = de::max(0, x - maxPositionDeviation.x()); sx <= de::min(width  - 1, x + maxPositionDeviation.x()) && !pixelFoundForResult; ++sx)
					{
						const IVec4	deviatedRefPix	= reference.getPixelInt(sx, sy, sz);
						const UVec4	diff			= abs(cmpPix - deviatedRefPix).cast<deUint32>();
						const bool	isOk			= boolAll(lessThanEqual(diff, threshold));

						pixelFoundForResult			= isOk;
					}

					if (!pixelFoundForResult)
					{
						errorMask.setPixel(errorColor, x, y, z);
						++numFailingPixels;
						continue;
					}
				}
			}
		}
	}

	return numFailingPixels;
}